

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

vector<DataElement,_std::allocator<DataElement>_> * __thiscall
Client::ReceiveDataVector
          (vector<DataElement,_std::allocator<DataElement>_> *__return_storage_ptr__,Client *this)

{
  undefined8 in_RAX;
  ssize_t sVar1;
  int i;
  long lVar2;
  long lVar3;
  undefined8 local_38;
  int size;
  
  local_38 = in_RAX;
  sVar1 = recv(this->sockfd,&local_38,4,0);
  this->n = (int)sVar1;
  if ((int)sVar1 < 0) {
    puts("ERROR in Client reading from socket!");
  }
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            (__return_storage_ptr__,(long)(int)local_38,(allocator_type *)((long)&local_38 + 7));
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < (int)local_38; lVar2 = lVar2 + 1) {
    sVar1 = recv(this->sockfd,
                 (void *)((long)((__return_storage_ptr__->
                                 super__Vector_base<DataElement,_std::allocator<DataElement>_>).
                                 _M_impl.super__Vector_impl_data._M_start)->val + lVar3),0x10,0);
    this->n = (int)sVar1;
    if ((int)sVar1 < 0) {
      puts("ERROR in Client reading from socket!");
    }
    lVar3 = lVar3 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<DataElement> Client::ReceiveDataVector()
{
    int size;
    n = recv(sockfd, &size, sizeof(size), 0);
    if (n < 0)
        printf("ERROR in Client reading from socket!\n");
 
    std::vector<DataElement> V(size);
    for (int i = 0; i < size; i++)
    {
        n = recv(sockfd, &V[i], sizeof(V[i]), 0);
        if (n < 0)
            printf("ERROR in Client reading from socket!\n");
    }
    return V;
}